

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_extrude.cpp
# Opt level: O2

bool ON_BrepConeLoop(ON_Brep *brep,int loop_index,ON_3dPoint apex_point)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ON_BrepTrim *pOVar4;
  ON_BrepEdge *pOVar5;
  ON_3dPoint vertex_point;
  ON_BrepVertex *pOVar6;
  long lVar7;
  ON_NurbsSurface *pSurface;
  ON_BrepFace *pOVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  bool bVar14;
  uint local_70;
  undefined4 local_6c;
  int vid [4];
  int eid [4];
  
  if ((loop_index < 0) &&
     ((brep->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_count <=
      loop_index)) {
    bVar14 = false;
  }
  else {
    uVar13 = (brep->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a
             [loop_index].m_ti.m_count;
    bVar14 = uVar13 != 0;
    if (bVar14) {
      iVar1 = (brep->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_count
      ;
      iVar2 = (brep->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.m_count
      ;
      uVar11 = 0;
      ON_BrepExtrudeHelper_ReserveSpace(brep,uVar13,0);
      vertex_point.y = apex_point.y;
      vertex_point.x = apex_point.x;
      vertex_point.z = apex_point.z;
      pOVar6 = ON_Brep::NewVertex(brep,vertex_point,0.0);
      uVar12 = (ulong)uVar13;
      if ((int)uVar13 < 1) {
        uVar12 = uVar11;
      }
      uVar13 = 0xffffffff;
      local_70 = 0xffffffff;
      for (; uVar11 != uVar12; uVar11 = uVar11 + 1) {
        iVar3 = (brep->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a
                [loop_index].m_ti.m_a[uVar11];
        lVar7 = (long)iVar3;
        if ((-1 < lVar7) && (iVar3 < iVar2)) {
          for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
            vid[lVar9] = -1;
            eid[lVar9] = -1;
          }
          pOVar4 = (brep->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
                   m_a;
          lVar9 = (long)pOVar4[lVar7].m_ei;
          if ((-1 < lVar9) && (pOVar4[lVar7].m_ei < iVar1)) {
            pOVar5 = (brep->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.
                     m_a;
            vid[0] = pOVar4[lVar7].m_vi[1];
            vid[1] = pOVar4[lVar7].m_vi[0];
            eid[0] = pOVar5[lVar9].m_edge_index;
            local_6c = pOVar4[lVar7].m_bRev3d ^ 1;
            pSurface = ON_BrepExtrudeHelper_MakeConeSrf
                                 (&apex_point,pOVar5 + lVar9,(bool)(pOVar4[lVar7].m_bRev3d ^ 1));
            if (pSurface != (ON_NurbsSurface *)0x0) {
              vid[3] = pOVar6->m_vertex_index;
              vid[2] = vid[3];
              if (-1 < (int)uVar13) {
                pOVar4 = (brep->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                         super_ON_ClassArray<ON_BrepTrim>.m_a;
                iVar3 = (brep->m_L).super_ON_ObjectArray<ON_BrepLoop>.
                        super_ON_ClassArray<ON_BrepLoop>.m_a
                        [*(brep->m_F).super_ON_ObjectArray<ON_BrepFace>.
                          super_ON_ClassArray<ON_BrepFace>.m_a[uVar13].m_li.m_a].m_ti.m_a[3];
                vid[2] = pOVar4[iVar3].m_vi[0];
                eid[1] = pOVar4[iVar3].m_ei;
                local_6c = CONCAT22(local_6c._2_2_,CONCAT11(pOVar4[iVar3].m_bRev3d,local_6c._0_1_))
                           ^ 0x100;
              }
              if (-1 < (int)local_70) {
                pOVar4 = (brep->m_T).super_ON_ObjectArray<ON_BrepTrim>.
                         super_ON_ClassArray<ON_BrepTrim>.m_a;
                uVar10 = (ulong)local_70;
                if (pOVar4[uVar10].m_vi[0] == vid[0]) {
                  vid[3] = pOVar4[uVar10].m_vi[1];
                  eid[3] = pOVar4[uVar10].m_ei;
                  local_6c = CONCAT13(pOVar4[uVar10].m_bRev3d,(undefined3)local_6c) ^ 0x1000000;
                }
              }
              pOVar8 = ON_Brep::NewFace(brep,&pSurface->super_ON_Surface,vid,eid,(bool *)&local_6c);
              if ((pOVar8 != (ON_BrepFace *)0x0) &&
                 (uVar13 = pOVar8->m_face_index, (int)local_70 < 0)) {
                local_70 = (brep->m_L).super_ON_ObjectArray<ON_BrepLoop>.
                           super_ON_ClassArray<ON_BrepLoop>.m_a[*(pOVar8->m_li).m_a].m_ti.m_a[1];
              }
            }
          }
        }
      }
    }
  }
  return bVar14;
}

Assistant:

bool ON_BrepConeLoop( 
          ON_Brep& brep,
          int loop_index,
          ON_3dPoint apex_point
          )
{
  if ( loop_index < 0 && loop_index >= brep.m_L.Count() )
    return false;

  int lti, ti, i, vid[4], eid[4];
  bool bRev3d[4];

  // indices of new faces appended to the side_face_index[] array 
  // (1 face index for each trim, -1 is used for singular trims)

  // count number of new objects so we can grow arrays
  // efficiently and use refs to dynamic array elements.
  const int loop_trim_count = brep.m_L[loop_index].m_ti.Count();
  if ( loop_trim_count == 0 )
    return false;

  // save input trim and edge counts for use below
  const int trim_count0 = brep.m_T.Count();
  const int edge_count0 = brep.m_E.Count();

  ON_BrepExtrudeHelper_ReserveSpace( brep, loop_trim_count, 0 );

  int prev_face_index = -1;
  int first_face_east_trim_index = -1;

  ON_BrepVertex& apex_vertex = brep.NewVertex( apex_point, 0.0 );

  for ( lti = 0; lti < loop_trim_count; lti++ )
  {
    ON_NurbsSurface* cone_srf = 0;
    ti = brep.m_L[loop_index].m_ti[lti];
    if ( ti < 0 || ti >= trim_count0 )
      continue;

    for ( i = 0; i < 4; i++ )
    {
      vid[i] = -1;
      eid[i] = -1;
    }
    bRev3d[0] = false;
    bRev3d[1] = false;
    bRev3d[2] = false;
    bRev3d[3] = false;

    // get side surface for new face
    // get side surface for new face
    {
      ON_BrepTrim& trim = brep.m_T[ti];
      if ( trim.m_ei >= 0 &&  trim.m_ei < edge_count0 )
      {
        const ON_BrepEdge& base_edge = brep.m_E[trim.m_ei];

        // connect new face to existing topology on trim
        vid[0] = trim.m_vi[1];
        vid[1] = trim.m_vi[0];
        eid[0] = base_edge.m_edge_index;
        bRev3d[0] = (trim.m_bRev3d?false:true);
        cone_srf = ON_BrepExtrudeHelper_MakeConeSrf( apex_point, base_edge, bRev3d[0] );
      }
    }
    if ( !cone_srf )
      continue;
    vid[2] = apex_vertex.m_vertex_index;
    vid[3] = apex_vertex.m_vertex_index;

    if ( prev_face_index >= 0 )
    {
      const ON_BrepTrim& prev_west_trim = brep.m_T[ brep.m_L[ brep.m_F[prev_face_index].m_li[0]].m_ti[3] ];
      vid[2] = prev_west_trim.m_vi[0];
      eid[1] = prev_west_trim.m_ei;
      bRev3d[1] = (prev_west_trim.m_bRev3d?false:true);
    }
    if ( first_face_east_trim_index >= 0 && brep.m_T[first_face_east_trim_index].m_vi[0] == vid[0] )
    {
      const ON_BrepTrim& first_face_east_trim = brep.m_T[first_face_east_trim_index];
      vid[3] = first_face_east_trim.m_vi[1];
      eid[3] = first_face_east_trim.m_ei;
      bRev3d[3] = (first_face_east_trim.m_bRev3d?false:true);
    }
    const ON_BrepFace* side_face = brep.NewFace(cone_srf,vid,eid,bRev3d);
    if ( side_face )
    {
      prev_face_index = side_face->m_face_index;
      if ( first_face_east_trim_index < 0 )
        first_face_east_trim_index = brep.m_L[ side_face->m_li[0] ].m_ti[1];
    }
  }

  return true;
}